

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.cpp
# Opt level: O2

OpenMPClause * OpenMPUsesAllocatorsClause::addUsesAllocatorsClause(OpenMPDirective *directive)

{
  vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *this;
  mapped_type *ppvVar1;
  key_type local_1c;
  OpenMPClause *local_18;
  
  this = OpenMPDirective::getClauses(directive,OMPC_uses_allocators);
  if ((this->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    this = (vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)operator_new(0x18);
    (this->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c = OMPC_uses_allocators;
    ppvVar1 = std::
              map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
              ::operator[](&directive->clauses,&local_1c);
    *ppvVar1 = this;
  }
  local_18 = (OpenMPClause *)operator_new(0x80);
  (local_18->super_SourceLocation).line = 0;
  (local_18->super_SourceLocation).column = 0;
  (local_18->super_SourceLocation).parent_construct = (SourceLocation *)0x0;
  local_18->kind = OMPC_uses_allocators;
  local_18->clause_position = -1;
  (local_18->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18->_vptr_OpenMPClause = (_func_int **)&PTR_toString_abi_cxx11__0019d908;
  local_18[1].super_SourceLocation.parent_construct = (SourceLocation *)0x0;
  local_18[1]._vptr_OpenMPClause = (_func_int **)0x0;
  local_18[1].super_SourceLocation.line = 0;
  local_18[1].super_SourceLocation.column = 0;
  std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::push_back(this,&local_18);
  return local_18;
}

Assistant:

OpenMPClause* OpenMPUsesAllocatorsClause::addUsesAllocatorsClause(OpenMPDirective *directive) {
    std::map<OpenMPClauseKind, std::vector<OpenMPClause*>* >* all_clauses = directive->getAllClauses();
    std::vector<OpenMPClause*>* current_clauses = directive->getClauses(OMPC_uses_allocators);
    OpenMPClause* new_clause = NULL;
    if (current_clauses->size() == 0) {
        current_clauses = new std::vector<OpenMPClause *>();
        (*all_clauses)[OMPC_uses_allocators] = current_clauses;
    };
    new_clause = new OpenMPUsesAllocatorsClause();
    current_clauses->push_back(new_clause);

    return new_clause;
}